

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O1

void __thiscall
iutest::detail::
TypeParameterizedTestSuite<test::prod_test::ProdTypeParamTest,_iutest::detail::VariadicTemplateTypeList<test::prod_test::iutest_typed_test_suite_p_name_ProdTypeParamTest_::Friend>,_iutest::detail::VariadicTypeList<int>_>
::
EachTest<int,_iutest::detail::VariadicTemplateTypeList<test::prod_test::iutest_typed_test_suite_p_name_ProdTypeParamTest_::Friend>_>
::EachTest(EachTest<int,_iutest::detail::VariadicTemplateTypeList<test::prod_test::iutest_typed_test_suite_p_name_ProdTypeParamTest_::Friend>_>
           *this,TestSuite *testsuite,string *name)

{
  UnitTest *pUVar1;
  
  (this->super_iuIObject)._vptr_iuIObject = (_func_int **)&PTR__EachTest_003af188;
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = testsuite;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_003a9690;
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_003af1c0;
  TestInfo::TestInfo(&this->m_info,&(this->m_mediator).super_iuITestSuiteMediator,name,
                     &(this->m_factory).super_iuFactoryBase);
  pUVar1 = UnitTest::instance();
  (pUVar1->super_UnitTestImpl).m_total_test_num = (pUVar1->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(testsuite,&this->m_info);
  return;
}

Assistant:

EachTest(TestSuite* testsuite, const ::std::string& name)
            : m_mediator(testsuite)
            , m_info(&m_mediator, name, &m_factory)
        {
            UnitTest::instance().AddTestInfo(testsuite, &m_info);
        }